

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::ArrayPtr<char_const>&,char_const(&)[18],char*>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params,
          char (*params_1) [18],char **params_2)

{
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  undefined8 local_30;
  undefined8 uStack_28;
  
  local_30 = *(undefined8 *)this;
  uStack_28 = *(undefined8 *)(this + 8);
  local_40 = toCharSequence<char_const(&)[18]>((char (*) [18])params);
  local_50 = toCharSequence<char*>((char **)params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,&local_50,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}